

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStg.c
# Opt level: O2

void Gia_ManStgPrint(FILE *pFile,Vec_Int_t *vLines,int nIns,int nOuts,int nStates)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint *puVar6;
  ulong uVar7;
  int i;
  uint uVar8;
  
  uVar8 = nStates;
  if (1 < (uint)nStates) {
    uVar8 = 0;
    for (uVar7 = (ulong)(nStates - 1); (int)uVar7 != 0; uVar7 = uVar7 / 10) {
      uVar8 = uVar8 + 1;
    }
  }
  uVar5 = vLines->nSize;
  if ((uVar5 & 3) != 0) {
    __assert_fail("Vec_IntSize(vLines) % 4 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                  ,0x19a,"void Gia_ManStgPrint(FILE *, Vec_Int_t *, int, int, int)");
  }
  i = 0;
  while( true ) {
    if ((int)uVar5 <= i) {
      return;
    }
    iVar1 = Vec_IntEntry(vLines,i);
    iVar2 = Vec_IntEntry(vLines,i + 1);
    iVar3 = Vec_IntEntry(vLines,i + 2);
    iVar4 = Vec_IntEntry(vLines,i + 3);
    if ((iVar1 < 0) || (1 << ((byte)nIns & 0x1f) <= iVar1)) {
      __assert_fail("iMint >= 0 && iMint < (1<<nIns)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                    ,0x1a1,"void Gia_ManStgPrint(FILE *, Vec_Int_t *, int, int, int)");
    }
    if ((iVar2 < 1) || (nStates < iVar2)) {
      __assert_fail("iCur >= 0 && iCur < nStates",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                    ,0x1a2,"void Gia_ManStgPrint(FILE *, Vec_Int_t *, int, int, int)");
    }
    if ((iVar3 < 1) || (nStates < iVar3)) break;
    if ((iVar4 < 0) || (1 << ((byte)nOuts & 0x1f) <= iVar4)) {
      __assert_fail("iOut >= 0 && iOut < (1<<nOuts)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                    ,0x1a4,"void Gia_ManStgPrint(FILE *, Vec_Int_t *, int, int, int)");
    }
    puVar6 = (uint *)Vec_IntEntryP(vLines,i);
    Extra_PrintBinary(pFile,puVar6,nIns);
    uVar5 = Vec_IntEntry(vLines,i + 1);
    fprintf((FILE *)pFile," %*d",(ulong)uVar8,(ulong)uVar5);
    uVar5 = Vec_IntEntry(vLines,i + 2);
    fprintf((FILE *)pFile," %*d ",(ulong)uVar8,(ulong)uVar5);
    puVar6 = (uint *)Vec_IntEntryP(vLines,i + 3);
    Extra_PrintBinary(pFile,puVar6,nOuts);
    fputc(10,(FILE *)pFile);
    uVar5 = vLines->nSize;
    i = i + 4;
  }
  __assert_fail("iNext >= 0 && iNext < nStates",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                ,0x1a3,"void Gia_ManStgPrint(FILE *, Vec_Int_t *, int, int, int)");
}

Assistant:

void Gia_ManStgPrint( FILE * pFile, Vec_Int_t * vLines, int nIns, int nOuts, int nStates )
{
    int i, nDigits = Abc_Base10Log( nStates );
    assert( Vec_IntSize(vLines) % 4 == 0 );
    for ( i = 0; i < Vec_IntSize(vLines); i += 4 )
    {
        int iMint = Vec_IntEntry(vLines, i  );
        int iCur  = Vec_IntEntry(vLines, i+1) - 1;
        int iNext = Vec_IntEntry(vLines, i+2) - 1;
        int iOut  = Vec_IntEntry(vLines, i+3);
        assert( iMint >= 0 && iMint < (1<<nIns)  );
        assert( iCur  >= 0 && iCur  < nStates    );
        assert( iNext >= 0 && iNext < nStates    );
        assert( iOut  >= 0 && iOut  < (1<<nOuts) );
        Extra_PrintBinary( pFile, (unsigned *)Vec_IntEntryP(vLines, i),  nIns );
        fprintf( pFile, " %*d",  nDigits,     Vec_IntEntry(vLines,  i+1) );
        fprintf( pFile, " %*d ", nDigits,     Vec_IntEntry(vLines,  i+2) );
        Extra_PrintBinary( pFile, (unsigned *)Vec_IntEntryP(vLines, i+3), nOuts );
        fprintf( pFile, "\n" );
    }
}